

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O3

void __thiscall lexer_exception::~lexer_exception(lexer_exception *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__lexer_exception_001539e8;
  pcVar1 = (this->msg_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg_).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~lexer_exception() throw() { }